

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

ON_Interval __thiscall ON_PolyCurve::Domain(ON_PolyCurve *this)

{
  double t0;
  double t1;
  int iVar1;
  double *pdVar2;
  ON_Interval d;
  ON_Interval local_18;
  
  ON_Interval::ON_Interval(&local_18);
  iVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if ((0 < (long)iVar1) && (iVar1 + 1 == (this->m_t).m_count)) {
    pdVar2 = (this->m_t).m_a;
    t0 = *pdVar2;
    t1 = pdVar2[iVar1];
    if (t0 < t1) {
      ON_Interval::Set(&local_18,t0,t1);
    }
  }
  return (ON_Interval)local_18.m_t;
}

Assistant:

ON_Interval ON_PolyCurve::Domain() const
{
  ON_Interval d;
  const int count = Count();
  if ( count > 0 && count+1 == m_t.Count() && m_t[0] < m_t[count] ) {
    d.Set(m_t[0],m_t[count]);
  }
  return d;
}